

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

FILE * download_and_open(char *fn)

{
  char *__filename;
  int iVar1;
  size_t sVar2;
  hFILE *fp_00;
  FILE *__stream;
  void *buffer;
  ssize_t sVar3;
  char *pcStack_48;
  int l;
  char *p;
  char *url;
  hFILE *fp_remote;
  FILE *fp;
  uint8_t *buf;
  int buf_size;
  char *fn_local;
  
  sVar2 = strlen(fn);
  pcStack_48 = fn + (int)sVar2;
  do {
    __filename = pcStack_48;
    pcStack_48 = __filename + -1;
    if (pcStack_48 < fn) break;
  } while (*pcStack_48 != '/');
  fn_local = (char *)fopen(__filename,"r");
  if ((FILE *)fn_local == (FILE *)0x0) {
    fp_00 = hopen(fn,"rb");
    if (fp_00 == (hFILE *)0x0) {
      fprintf(_stderr,"[download_from_remote] fail to open remote file %s\n",fn);
      fn_local = (char *)0x0;
    }
    else {
      __stream = fopen(__filename,"wb");
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"[download_from_remote] fail to create file in the working directory %s\n",
                __filename);
        hclose_abruptly(fp_00);
        fn_local = (char *)0x0;
      }
      else {
        buffer = calloc(0x100000,1);
        while( true ) {
          sVar3 = hread(fp_00,buffer,0x100000);
          if ((int)sVar3 < 1) break;
          fwrite(buffer,1,(long)(int)sVar3,__stream);
        }
        free(buffer);
        fclose(__stream);
        iVar1 = hclose(fp_00);
        if (iVar1 != 0) {
          fprintf(_stderr,"[download_from_remote] fail to close remote file %s\n",fn);
        }
        fn_local = (char *)fopen(__filename,"r");
      }
    }
  }
  return (FILE *)fn_local;
}

Assistant:

static FILE *download_and_open(const char *fn)
{
    const int buf_size = 1 * 1024 * 1024;
    uint8_t *buf;
    FILE *fp;
    hFILE *fp_remote;
    const char *url = fn;
    const char *p;
    int l = strlen(fn);
    for (p = fn + l - 1; p >= fn; --p)
        if (*p == '/') break;
    fn = p + 1;

    // First try to open a local copy
    fp = fopen(fn, "r");
    if (fp)
        return fp;

    // If failed, download from remote and open
    fp_remote = hopen(url, "rb");
    if (fp_remote == 0) {
        fprintf(stderr, "[download_from_remote] fail to open remote file %s\n",url);
        return NULL;
    }
    if ((fp = fopen(fn, "wb")) == 0) {
        fprintf(stderr, "[download_from_remote] fail to create file in the working directory %s\n",fn);
        hclose_abruptly(fp_remote);
        return NULL;
    }
    buf = (uint8_t*)calloc(buf_size, 1);
    while ((l = hread(fp_remote, buf, buf_size)) > 0)
        fwrite(buf, 1, l, fp);
    free(buf);
    fclose(fp);
    if (hclose(fp_remote) != 0)
        fprintf(stderr, "[download_from_remote] fail to close remote file %s\n", url);

    return fopen(fn, "r");
}